

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

string * __thiscall
duckdb::SecretManager::DefaultStorage_abi_cxx11_(string *__return_storage_ptr__,SecretManager *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->config).default_persistent_storage._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->config).default_persistent_storage._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string SecretManager::DefaultStorage() {
	return config.default_persistent_storage;
}